

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::CoverageBinsArraySizeSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,CoverageBinsArraySizeSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  if (this == (CoverageBinsArraySizeSyntax *)0x2) {
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 3);
  }
  else {
    if (this == (CoverageBinsArraySizeSyntax *)0x1) {
      return *(PtrTokenOrSyntax **)
              ((long)&__return_storage_ptr__[2].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
    }
    if (this != (CoverageBinsArraySizeSyntax *)0x0) {
      return (PtrTokenOrSyntax *)0x0;
    }
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax CoverageBinsArraySizeSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openBracket;
        case 1: return expr;
        case 2: return &closeBracket;
        default: return nullptr;
    }
}